

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

symbol * Symbol_find(char *key)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  s_x2node *psVar4;
  
  iVar3 = 0;
  if (x2a != (s_x2 *)0x0) {
    cVar1 = *key;
    if (cVar1 != '\0') {
      pcVar2 = key + 1;
      iVar3 = 0;
      do {
        iVar3 = (int)cVar1 + iVar3 * 0xd;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar1 != '\0');
    }
    for (psVar4 = x2a->ht[(long)iVar3 & (long)x2a->size - 1U]; psVar4 != (s_x2node *)0x0;
        psVar4 = psVar4->next) {
      iVar3 = strcmp(psVar4->key,key);
      if (iVar3 == 0) {
        return psVar4->data;
      }
    }
  }
  return (symbol *)0x0;
}

Assistant:

struct symbol *Symbol_find(const char *key)
{
  int h;
  x2node *np;

  if( x2a==0 ) return 0;
  h = strhash(key) & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}